

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O3

void Rml::Parse::Factor(DataParser *parser)

{
  pointer pcVar1;
  ulong uVar2;
  double value;
  int iVar3;
  ulong uVar4;
  long *plVar5;
  uint uVar6;
  bool *out_valid_function_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  byte bVar8;
  char cVar9;
  ulong uVar10;
  char cVar11;
  bool bVar12;
  bool valid_function_name;
  size_type __dnew;
  String full_address;
  ProgramState backup_state;
  undefined1 local_a1;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  String local_78;
  String local_58;
  ProgramState local_38;
  
  if (parser->reached_end != false) {
LAB_001f27d1:
    local_78._M_dataplus._M_p = (pointer)0x3a;
    local_a0._0_8_ = &local_90;
    local_a0._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_a0,(ulong)&local_78);
    local_90._M_allocated_capacity = (size_type)local_78._M_dataplus._M_p;
    *(char *)(local_a0._0_8_ + 0x2a) = 'e';
    *(char *)(local_a0._0_8_ + 0x2b) = 'n';
    *(char *)(local_a0._0_8_ + 0x2c) = 't';
    *(char *)(local_a0._0_8_ + 0x2d) = 'h';
    *(char *)(local_a0._0_8_ + 0x2e) = 'e';
    *(char *)(local_a0._0_8_ + 0x2f) = 's';
    *(char *)(local_a0._0_8_ + 0x30) = 'i';
    *(char *)(local_a0._0_8_ + 0x31) = 's';
    *(char *)(local_a0._0_8_ + 0x32) = ',';
    *(char *)(local_a0._0_8_ + 0x33) = ' ';
    *(char *)(local_a0._0_8_ + 0x34) = 'o';
    *(char *)(local_a0._0_8_ + 0x35) = 'r';
    *(char *)(local_a0._0_8_ + 0x36) = ' ';
    *(char *)(local_a0._0_8_ + 0x37) = '\'';
    *(char *)(local_a0._0_8_ + 0x38) = '!';
    *(char *)(local_a0._0_8_ + 0x39) = '\'';
    *(char *)(local_a0._0_8_ + 0x20) = ' ';
    *(char *)(local_a0._0_8_ + 0x21) = 'n';
    *(char *)(local_a0._0_8_ + 0x22) = 'a';
    *(char *)(local_a0._0_8_ + 0x23) = 'm';
    *(char *)(local_a0._0_8_ + 0x24) = 'e';
    *(char *)(local_a0._0_8_ + 0x25) = ',';
    *(char *)(local_a0._0_8_ + 0x26) = ' ';
    *(char *)(local_a0._0_8_ + 0x27) = 'p';
    *(char *)(local_a0._0_8_ + 0x28) = 'a';
    *(char *)(local_a0._0_8_ + 0x29) = 'r';
    *(char *)(local_a0._0_8_ + 0x2a) = 'e';
    *(char *)(local_a0._0_8_ + 0x2b) = 'n';
    *(char *)(local_a0._0_8_ + 0x2c) = 't';
    *(char *)(local_a0._0_8_ + 0x2d) = 'h';
    *(char *)(local_a0._0_8_ + 0x2e) = 'e';
    *(char *)(local_a0._0_8_ + 0x2f) = 's';
    *(char *)(local_a0._0_8_ + 0x10) = 'e';
    *(char *)(local_a0._0_8_ + 0x11) = ' ';
    *(char *)(local_a0._0_8_ + 0x12) = 'n';
    *(char *)(local_a0._0_8_ + 0x13) = 'a';
    *(char *)(local_a0._0_8_ + 0x14) = 'm';
    *(char *)(local_a0._0_8_ + 0x15) = 'e';
    *(char *)(local_a0._0_8_ + 0x16) = ',';
    *(char *)(local_a0._0_8_ + 0x17) = ' ';
    *(char *)(local_a0._0_8_ + 0x18) = 'f';
    *(char *)(local_a0._0_8_ + 0x19) = 'u';
    *(char *)(local_a0._0_8_ + 0x1a) = 'n';
    *(char *)(local_a0._0_8_ + 0x1b) = 'c';
    *(char *)(local_a0._0_8_ + 0x1c) = 't';
    *(char *)(local_a0._0_8_ + 0x1d) = 'i';
    *(char *)(local_a0._0_8_ + 0x1e) = 'o';
    *(char *)(local_a0._0_8_ + 0x1f) = 'n';
    *(undefined8 *)local_a0._0_8_ = 0x2c6c61726574696c;
    *(char *)(local_a0._0_8_ + 8) = ' ';
    *(char *)(local_a0._0_8_ + 9) = 'v';
    *(char *)(local_a0._0_8_ + 10) = 'a';
    *(char *)(local_a0._0_8_ + 0xb) = 'r';
    *(char *)(local_a0._0_8_ + 0xc) = 'i';
    *(char *)(local_a0._0_8_ + 0xd) = 'a';
    *(char *)(local_a0._0_8_ + 0xe) = 'b';
    *(char *)(local_a0._0_8_ + 0xf) = 'l';
    local_a0._8_8_ = local_78._M_dataplus._M_p;
    *(char *)(local_a0._0_8_ + (long)local_78._M_dataplus._M_p) = '\0';
    DataParser::Expected(parser,(String *)local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._0_8_ != &local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
    }
    return;
  }
  pcVar1 = (parser->expression)._M_dataplus._M_p;
  bVar8 = pcVar1[parser->index];
  out_valid_function_name = (bool *)(ulong)bVar8;
  if (bVar8 < 0x28) {
    if (bVar8 == 0x21) {
      DataParser::Match(parser,'!',true);
      Factor(parser);
      Variant::Variant((Variant *)local_a0);
      DataParser::Emit(parser,Not,(Variant *)local_a0);
      Variant::~Variant((Variant *)local_a0);
      bVar8 = parser->reached_end;
      pcVar1 = (parser->expression)._M_dataplus._M_p;
      uVar4 = parser->index;
      if ((bool)bVar8 == false) {
        uVar10 = (ulong)(byte)pcVar1[uVar4];
      }
      else {
        uVar10 = 0;
      }
      uVar2 = (parser->expression)._M_string_length;
      do {
        while( true ) {
          uVar4 = uVar4 + 1;
          if (0x20 < (byte)uVar10) {
            return;
          }
          if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
            return;
          }
          parser->index = uVar4;
          if (uVar4 < uVar2) break;
          parser->reached_end = true;
          bVar8 = 1;
LAB_001f2ba5:
          uVar10 = 0;
        }
        if ((bVar8 & 1) != 0) goto LAB_001f2ba5;
        uVar10 = (ulong)(byte)pcVar1[uVar4];
      } while( true );
    }
    if (bVar8 == 0x27) {
      DataParser::Match(parser,'\'',false);
      paVar7 = &local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)paVar7;
      if ((parser->reached_end == false) &&
         (cVar11 = (parser->expression)._M_dataplus._M_p[parser->index], cVar11 != '\0')) {
        cVar9 = '\0';
        while (cVar9 == '\\' || cVar11 != '\'') {
          bVar12 = cVar9 == '\\';
          cVar9 = cVar11;
          if ((bVar12) && ((cVar11 == '\\' || (cVar11 == '\'')))) {
            ::std::__cxx11::string::pop_back();
            cVar9 = '\0';
          }
          ::std::__cxx11::string::push_back((char)&local_78);
          uVar4 = parser->index + 1;
          parser->index = uVar4;
          if ((parser->expression)._M_string_length <= uVar4) {
            parser->reached_end = true;
            break;
          }
          if (((parser->reached_end & 1U) != 0) ||
             (cVar11 = (parser->expression)._M_dataplus._M_p[uVar4], cVar11 == '\0')) break;
        }
      }
      local_a0._0_8_ = (pointer)0x2d;
      Variant::Set((Variant *)local_a0,&local_78);
      DataParser::Emit(parser,Literal,(Variant *)local_a0);
      Variant::~Variant((Variant *)local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar7) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      DataParser::Match(parser,'\'',true);
      return;
    }
  }
  else {
    if (bVar8 == 0x2d) goto LAB_001f2997;
    if (bVar8 == 0x28) {
      DataParser::Match(parser,'(',true);
      Expression(parser);
      DataParser::Match(parser,')',true);
      return;
    }
  }
  uVar6 = (int)CONCAT71((int7)((ulong)pcVar1 >> 8),bVar8) - 0x30;
  out_valid_function_name = (bool *)(ulong)uVar6;
  if ((byte)uVar6 < 10) {
LAB_001f2997:
    FindNumberLiteral_abi_cxx11_
              (&local_78,(Parse *)parser,(DataParser *)0x0,SUB81(out_valid_function_name,0));
    if (local_78._M_string_length != 0) {
      value = atof(local_78._M_dataplus._M_p);
      local_a0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x2d;
      Variant::Set((Variant *)local_a0,value);
      DataParser::Emit(parser,Literal,(Variant *)local_a0);
      Variant::~Variant((Variant *)local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
    bVar8 = parser->reached_end;
    pcVar1 = (parser->expression)._M_dataplus._M_p;
    uVar4 = parser->index;
    if ((bool)bVar8 == false) {
      uVar10 = (ulong)(byte)pcVar1[uVar4];
    }
    else {
      uVar10 = 0;
    }
    uVar2 = (parser->expression)._M_string_length;
    do {
      while( true ) {
        uVar4 = uVar4 + 1;
        if (0x20 < (byte)uVar10) {
          return;
        }
        if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
          return;
        }
        parser->index = uVar4;
        if (uVar4 < uVar2) break;
        parser->reached_end = true;
        bVar8 = 1;
LAB_001f2aab:
        uVar10 = 0;
      }
      if ((bVar8 & 1) != 0) goto LAB_001f2aab;
      uVar10 = (ulong)(byte)pcVar1[uVar4];
    } while( true );
  }
  if (0x19 < (byte)((bVar8 & 0xdf) + 0xbf)) goto LAB_001f27d1;
  local_a1 = '\x01';
  VariableOrFunctionName_abi_cxx11_
            (&local_78,(Parse *)parser,(DataParser *)&local_a1,out_valid_function_name);
  if (local_78._M_string_length == 0) {
    local_a0._0_8_ = &local_90;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a0,"Expected a variable or function name but got an empty name.","");
    DataParser::Error(parser,(String *)local_a0);
    local_58.field_2._M_allocated_capacity = local_90._M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)local_a0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._0_8_ == &local_90) goto LAB_001f2cdf;
LAB_001f2bf9:
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  else {
    iVar3 = ::std::__cxx11::string::compare((char *)&local_78);
    if (iVar3 == 0) {
      local_a0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x2d;
      Variant::Set((Variant *)local_a0,true);
      DataParser::Emit(parser,Literal,(Variant *)local_a0);
    }
    else {
      iVar3 = ::std::__cxx11::string::compare((char *)&local_78);
      if (iVar3 != 0) {
        if (parser->reached_end != false) {
LAB_001f2c9f:
          DataParser::VariableGetSet(parser,&local_78,false);
          goto LAB_001f2cdf;
        }
        cVar11 = (parser->expression)._M_dataplus._M_p[parser->index];
        if (cVar11 == '[') {
          local_38.program_length =
               ((long)(parser->program).
                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(parser->program).
                      super__Vector_base<Rml::InstructionData,_std::allocator<Rml::InstructionData>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
          local_38.stack_size = parser->program_stack_size;
          VariableExpression(&local_58,parser,&local_78);
          if (local_58._M_string_length == 0) {
            DataParser::AddVariableAddress(parser,&local_78);
            Variant::Variant((Variant *)local_a0);
            DataParser::Emit(parser,DynamicVariable,(Variant *)local_a0);
            Variant::~Variant((Variant *)local_a0);
          }
          else {
            DataParser::SetProgramState(parser,&local_38);
            DataParser::VariableGetSet(parser,&local_58,false);
          }
        }
        else {
          if (cVar11 != '(') goto LAB_001f2c9f;
          if (local_a1 != '\0') {
            Function(parser,TransformFnc,&local_78,false);
            goto LAB_001f2cdf;
          }
          ::std::operator+(&local_58,"Invalid function name \'",&local_78);
          plVar5 = (long *)::std::__cxx11::string::append((char *)&local_58);
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 == paVar7) {
            local_90._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_90._8_8_ = plVar5[3];
            local_a0._0_8_ = &local_90;
          }
          else {
            local_90._M_allocated_capacity = paVar7->_M_allocated_capacity;
            local_a0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar5;
          }
          local_a0._8_8_ = plVar5[1];
          *plVar5 = (long)paVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          DataParser::Error(parser,(String *)local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._0_8_ != &local_90) {
            operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == &local_58.field_2) goto LAB_001f2cdf;
        goto LAB_001f2bf9;
      }
      local_a0._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x2d;
      Variant::Set((Variant *)local_a0,false);
      DataParser::Emit(parser,Literal,(Variant *)local_a0);
    }
    Variant::~Variant((Variant *)local_a0);
  }
LAB_001f2cdf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  bVar8 = parser->reached_end;
  pcVar1 = (parser->expression)._M_dataplus._M_p;
  uVar4 = parser->index;
  if ((bool)bVar8 == false) {
    uVar10 = (ulong)(byte)pcVar1[uVar4];
  }
  else {
    uVar10 = 0;
  }
  uVar2 = (parser->expression)._M_string_length;
  do {
    while( true ) {
      uVar4 = uVar4 + 1;
      if (0x20 < (byte)uVar10) {
        return;
      }
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) {
        return;
      }
      parser->index = uVar4;
      if (uVar4 < uVar2) break;
      parser->reached_end = true;
      bVar8 = 1;
LAB_001f2d48:
      uVar10 = 0;
    }
    if ((bVar8 & 1) != 0) goto LAB_001f2d48;
    uVar10 = (ulong)(byte)pcVar1[uVar4];
  } while( true );
}

Assistant:

static void Factor(DataParser& parser)
	{
		const char c = parser.Look();

		if (c == '(')
		{
			parser.Match('(');
			Expression(parser);
			parser.Match(')');
		}
		else if (c == '\'')
		{
			parser.Match('\'', false);
			StringLiteral(parser);
			parser.Match('\'');
		}
		else if (c == '!')
		{
			Not(parser);
			parser.SkipWhitespace();
		}
		else if (c == '-' || (c >= '0' && c <= '9'))
		{
			NumberLiteral(parser);
			parser.SkipWhitespace();
		}
		else if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z'))
		{
			VariableOrFunction(parser);
			parser.SkipWhitespace();
		}
		else
			parser.Expected("literal, variable name, function name, parenthesis, or '!'");
	}